

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMeshControl::ConnectedElements
          (TPZMHMeshControl *this,int64_t skeleton,pair<long,_long> *leftright,
          map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
          *ellist)

{
  bool bVar1;
  int iVar2;
  TPZGeoMesh *this_00;
  reference celside_00;
  TPZGeoEl *this_01;
  int64_t index;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  *this_02;
  ostream *poVar3;
  void *this_03;
  size_type sVar4;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int mhm_domain;
  int64_t gelindex;
  TPZGeoEl *gel;
  TPZGeoElSide gelside;
  TPZCompElSide celside;
  iterator __end1;
  iterator __begin1;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *__range1;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> allconnected;
  TPZGeoElSide skelside;
  int meshdim;
  TPZGeoEl *gelskeleton;
  size_t in_stack_000002a8;
  char *in_stack_000002b0;
  TPZGeoElSide *in_stack_fffffffffffffe88;
  TPZGeoMesh *in_stack_fffffffffffffe90;
  TPZGeoEl *in_stack_fffffffffffffe98;
  TPZGeoElSide *in_stack_fffffffffffffea0;
  TPZCompElSide *in_stack_fffffffffffffea8;
  mapped_type *in_stack_fffffffffffffec8;
  TPZGeoElSide local_c8;
  TPZCompElSide local_b0;
  _Self local_a0;
  _Self local_98;
  undefined1 *local_90;
  undefined1 local_60 [52];
  int local_2c;
  TPZGeoEl *local_28;
  long *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  local_28 = TPZGeoMesh::Element(in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88);
  this_00 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  local_2c = TPZGeoMesh::Dimension(this_00);
  iVar2 = (**(code **)(*(long *)local_28 + 0x210))();
  if (iVar2 != local_2c + -1) {
    pzinternal::DebugStopImpl(in_stack_000002b0,in_stack_000002a8);
  }
  (**(code **)(*(long *)local_28 + 0xf0))();
  TPZGeoElSide::TPZGeoElSide
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::list
            ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)0x1e154be);
  TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  BuildConnectedElementList
            ((TPZMHMeshControl *)__begin1._M_node,(TPZGeoElSide *)__end1._M_node,
             (list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)celside._8_8_);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e154fb);
  local_90 = local_60;
  local_98._M_node =
       (_List_node_base *)
       std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::begin
                 ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)in_stack_fffffffffffffe88);
  local_a0._M_node =
       (_List_node_base *)
       std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::end
                 ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)in_stack_fffffffffffffe88);
  while (bVar1 = std::operator!=(&local_98,&local_a0), bVar1) {
    celside_00 = std::_List_iterator<TPZCompElSide>::operator*
                           ((_List_iterator<TPZCompElSide> *)0x1e15560);
    TPZCompElSide::TPZCompElSide(&local_b0,celside_00);
    TPZCompElSide::Reference(in_stack_fffffffffffffea8);
    this_01 = TPZGeoElSide::Element(&local_c8);
    index = TPZGeoEl::Index(this_01);
    this_02 = (map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
               *)TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 200),index);
    iVar2 = (int)*(undefined8 *)&(this_02->_M_t)._M_impl;
    if ((long)iVar2 == *local_18) {
      in_stack_fffffffffffffec8 =
           std::
           map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
           ::operator[](this_02,(key_type_conflict1 *)in_stack_fffffffffffffec8);
      std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::push_back
                ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)in_stack_fffffffffffffea0,
                 (value_type *)in_stack_fffffffffffffe98);
    }
    else if ((long)iVar2 == local_18[1]) {
      std::
      map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
      ::operator[](this_02,(key_type_conflict1 *)in_stack_fffffffffffffec8);
      std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::push_back
                ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)in_stack_fffffffffffffea0,
                 (value_type *)in_stack_fffffffffffffe98);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"I dont understand leftright : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_18);
      in_stack_fffffffffffffea8 = (TPZCompElSide *)std::operator<<(poVar3," ");
      in_stack_fffffffffffffea0 =
           (TPZGeoElSide *)std::ostream::operator<<(in_stack_fffffffffffffea8,local_18[1]);
      in_stack_fffffffffffffe98 =
           (TPZGeoEl *)std::operator<<((ostream *)in_stack_fffffffffffffea0," mhm_domain ");
      this_03 = (void *)std::ostream::operator<<(in_stack_fffffffffffffe98,iVar2);
      std::ostream::operator<<(this_03,std::endl<char,std::char_traits<char>>);
    }
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e157da);
    std::_List_iterator<TPZCompElSide>::operator++(&local_98);
  }
  sVar4 = std::
          map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
          ::size((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                  *)0x1e157f9);
  if (sVar4 == 0) {
    pzinternal::DebugStopImpl(in_stack_000002b0,in_stack_000002a8);
  }
  if ((local_10 == local_18[1]) &&
     (sVar4 = std::
              map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
              ::size((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                      *)0x1e15837), sVar4 != 1)) {
    pzinternal::DebugStopImpl(in_stack_000002b0,in_stack_000002a8);
  }
  if ((local_10 != local_18[1]) &&
     (sVar4 = std::
              map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
              ::size((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                      *)0x1e15875), sVar4 != 2)) {
    pzinternal::DebugStopImpl(in_stack_000002b0,in_stack_000002a8);
  }
  std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::~list
            ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)0x1e1589d);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e158aa);
  return;
}

Assistant:

void TPZMHMeshControl::ConnectedElements(int64_t skeleton, std::pair<int64_t,int64_t> &leftright, std::map<int64_t, std::list<TPZCompElSide> > &ellist)
{
    TPZGeoEl *gelskeleton = fGMesh->Element(skeleton);
    int meshdim = fGMesh->Dimension();
    if (gelskeleton->Dimension() != meshdim-1) {
        DebugStop();
    }
    TPZGeoElSide skelside(gelskeleton,gelskeleton->NSides()-1);

    std::list<TPZCompElSide> allconnected;
    BuildConnectedElementList(skelside, allconnected);
    
#ifdef PZDEBUG
    // verify if the acumulated area of allconnected is the area of the element
    REAL area = gelskeleton->SideArea(gelskeleton->NSides()-1);
    REAL listarea = 0.;
    for(auto it : allconnected)
    {
        TPZGeoElSide gside = it.Reference();
        listarea += gside.Area();
    }
    REAL diff = fabs(area-listarea);
    REAL diff2 = fabs(2*area - listarea);
    if(diff > 1.e-3*area && diff2 >= 1.e-3*area)
    {
        std::cout << "The area of the connected elements does not correspond to the area " <<
        "of the skeleton element area = " << area << " listarea = " << listarea <<
        " diff/area = " << diff/area << " diff2/area " << diff2/area << std::endl;
    }
#endif
    
    for(auto celside : allconnected)
    {
        TPZGeoElSide gelside = celside.Reference();
        TPZGeoEl *gel = gelside.Element();
        int64_t gelindex = gel->Index();
        int mhm_domain = fGeoToMHMDomain[gelindex];
        if(mhm_domain == leftright.first)
        {
            ellist[mhm_domain].push_back(celside);
        }
        else if(mhm_domain == leftright.second)
        {
            ellist[mhm_domain].push_back(celside);
        }
        else
        {
            std::cout << "I dont understand leftright : " << leftright.first << " " <<
            leftright.second << " mhm_domain " << mhm_domain << std::endl;
        }
    }
    // a skeleton element with no computational elements is a bug
    if (ellist.size() == 0) {
        DebugStop();
    }
    // if the skeleton is boundary and if there are more than one subdomain, it is a bug
    if (skeleton == leftright.second && ellist.size() != 1) {
        DebugStop();
    }
    // if the skeleton is not boundary then there must be exactly two subdomains connected
    if(skeleton != leftright.second && ellist.size() != 2)
    {
        DebugStop();
    }
}